

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Expression * __thiscall
soul::heart::Parser::parseExpression(Parser *this,FunctionParseState *state,Type *requiredType)

{
  Expression *pEVar1;
  undefined1 local_30 [8];
  CodeLocation errorPos;
  Type *requiredType_local;
  FunctionParseState *state_local;
  Parser *this_local;
  
  errorPos.location.data = (char *)requiredType;
  CodeLocation::CodeLocation
            ((CodeLocation *)local_30,
             &(this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ).location);
  pEVar1 = parseExpression(this,state);
  pEVar1 = checkExpressionType(this,pEVar1,(Type *)errorPos.location.data,(CodeLocation *)local_30);
  CodeLocation::~CodeLocation((CodeLocation *)local_30);
  return pEVar1;
}

Assistant:

heart::Expression& parseExpression (const FunctionParseState& state, const Type& requiredType)
    {
        auto errorPos = location;
        return checkExpressionType (parseExpression (state), requiredType, errorPos);
    }